

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BriefOperator.cpp
# Opt level: O0

void __thiscall lts2::BriefOperator::initWithPatchSize(BriefOperator *this,Size *patchSize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  IntegratingCell *pIVar5;
  ostream *poVar6;
  uint N;
  uint N_00;
  uint y_neg;
  uint x_neg;
  uint y_pos;
  uint x_pos;
  int i;
  double invCellArea;
  int usefulHeight;
  int usefulWidth;
  int detectorRadius;
  RNG rng;
  Size *patchSize_local;
  BriefOperator *this_local;
  
  cv::Size_<int>::Size_((Size_<int> *)&rng,patchSize);
  LBDOperator::setPatchSize(&this->super_LBDOperator,(Size *)&rng);
  cv::RNG::RNG((RNG *)&usefulWidth,0x2a);
  if (((this->super_LBDOperator)._sensitiveCells != (IntegratingCell *)0x0) &&
     (pIVar5 = (this->super_LBDOperator)._sensitiveCells, pIVar5 != (IntegratingCell *)0x0)) {
    operator_delete__(pIVar5);
  }
  N_00 = patchSize->width - 9;
  N = patchSize->height - 9;
  (this->super_LBDOperator)._patternPoints = N_00 * N;
  auVar1 = ZEXT416((uint)(*(int *)&(this->super_LBDOperator).super_LinearOperator.field_0xc << 1)) *
           ZEXT816(0x18);
  uVar4 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pIVar5 = (IntegratingCell *)operator_new__(uVar4);
  (this->super_LBDOperator)._sensitiveCells = pIVar5;
  poVar6 = std::operator<<((ostream *)&std::cerr,"Generating ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,*(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc);
  std::operator<<(poVar6," pairs.\n");
  for (y_pos = 0; y_pos < *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
      y_pos = y_pos + 1) {
    uVar2 = cv::RNG::operator()((RNG *)&usefulWidth,N_00);
    uVar3 = cv::RNG::operator()((RNG *)&usefulWidth,N);
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos << 1)].xmin = uVar2;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos << 1)].ymin = uVar3;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos << 1)].xmax = uVar2 + 9;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos << 1)].ymax = uVar3 + 9;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos << 1)].scaleFactor = 0.012345679012345678;
    uVar2 = cv::RNG::operator()((RNG *)&usefulWidth,N_00);
    uVar3 = cv::RNG::operator()((RNG *)&usefulWidth,N);
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos * 2 + 1)].xmin = uVar2;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos * 2 + 1)].ymin = uVar3;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos * 2 + 1)].xmax = uVar2 + 9;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos * 2 + 1)].ymax = uVar3 + 9;
    (this->super_LBDOperator)._sensitiveCells[(int)(y_pos * 2 + 1)].scaleFactor =
         0.012345679012345678;
    (this->super_LBDOperator)._basisFunctions[(int)y_pos].pos_cell = y_pos << 1;
    (this->super_LBDOperator)._basisFunctions[(int)y_pos].neg_cell = y_pos * 2 + 1;
  }
  std::operator<<((ostream *)&std::cerr,"Done !\n");
  return;
}

Assistant:

void lts2::BriefOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);

    cv::RNG rng(42);

    // Only 9x9 patches (except borders)
    int const detectorRadius = 9 / 2;

    // Reset
    if (_sensitiveCells)
      delete[] _sensitiveCells;

    // Points where we can have a sensitive cell
    int usefulWidth = patchSize.width - 9;
    int usefulHeight = patchSize.height - 9;
    _patternPoints = usefulWidth*usefulHeight;
    _sensitiveCells = new lbd::IntegratingCell[2*_pairsInUse];

    double invCellArea = 1.0/81.0;

    std::cerr << "Generating " << _pairsInUse << " pairs.\n";

    for (int i = 0; i < _pairsInUse; ++i)
    {
      unsigned int x_pos = rng(usefulWidth);
      unsigned int y_pos = rng(usefulHeight);

      _sensitiveCells[2*i].xmin = x_pos;
      _sensitiveCells[2*i].ymin = y_pos;
      _sensitiveCells[2*i].xmax = x_pos + 9;
      _sensitiveCells[2*i].ymax = y_pos + 9;
      _sensitiveCells[2*i].scaleFactor = invCellArea;

      unsigned int x_neg = rng(usefulWidth);
      unsigned int y_neg = rng(usefulHeight);

      _sensitiveCells[2*i+1].xmin = x_neg;
      _sensitiveCells[2*i+1].ymin = y_neg;
      _sensitiveCells[2*i+1].xmax = x_neg + 9;
      _sensitiveCells[2*i+1].ymax = y_neg + 9;
      _sensitiveCells[2*i+1].scaleFactor = invCellArea;

      _basisFunctions[i].pos_cell = 2*i;
      _basisFunctions[i].neg_cell = 2*i+1;
    }
    std::cerr << "Done !\n";
}